

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppcVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  size_t sVar6;
  istream *this;
  ostream *this_00;
  uint uVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  bool go_first;
  ulong uVar10;
  string *psVar11;
  int iVar12;
  int num_games;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string dir;
  string ab;
  stringstream ss;
  stringstream sss;
  int local_4d4;
  undefined1 *local_4d0 [2];
  undefined1 local_4c0 [16];
  undefined1 *local_4b0;
  long local_4a8;
  undefined1 local_4a0 [16];
  ios_base *local_490;
  undefined1 *local_488;
  int local_480;
  int local_47c;
  ulong local_478;
  undefined8 local_470;
  vector<char,_std::allocator<char>_> local_468;
  undefined1 *local_448;
  ios_base *local_440;
  string local_438 [4];
  ios_base aiStack_3b8 [392];
  undefined1 *local_230;
  filebuf local_228 [8];
  undefined1 local_220 [112];
  ios_base local_1b0 [120];
  ios_base local_138 [264];
  
  local_4d4 = -1;
  uVar10 = 0;
  if (argc < 1) {
    go_first = true;
    bVar3 = 0;
  }
  else {
    local_440 = local_1b0;
    local_490 = aiStack_3b8;
    puVar8 = (undefined1 *)(ulong)(uint)argc;
    go_first = true;
    puVar9 = (undefined1 *)0x0;
    local_470 = 0;
    local_478 = 0;
    local_480 = argc;
    local_448 = puVar8;
    do {
      pcVar2 = argv[(long)puVar9];
      if (*pcVar2 == '-') {
        local_230 = local_220;
        local_488 = puVar9;
        sVar6 = strlen(pcVar2 + 3);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_230,pcVar2 + 3,pcVar2 + sVar6 + 3);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_438,(string *)&local_230,_S_out|_S_in);
        ppcVar1 = &local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        if (local_230 != local_220) {
          operator_delete(local_230);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&local_230);
        local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_1_ = 0;
        bVar3 = pcVar2[1];
        local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)ppcVar1;
        if (bVar3 < 0x70) {
          if (bVar3 == 0x62) {
            psVar11 = &board_file_abi_cxx11_;
LAB_0010bbe7:
            std::operator>>((istream *)local_438,(string *)psVar11);
          }
          else if (bVar3 == 99) {
            local_4b0 = local_4a0;
            local_4a8 = 0;
            local_4a0[0] = 0;
            std::operator>>((istream *)local_438,(string *)&local_4b0);
            local_4d0[0] = local_4c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_4d0,local_4b0,local_4b0 + local_4a8);
            std::__cxx11::string::append((char *)local_4d0);
            std::__cxx11::string::operator=((string *)&board_file_abi_cxx11_,(string *)local_4d0);
            if (local_4d0[0] != local_4c0) {
              operator_delete(local_4d0[0]);
            }
            local_4d0[0] = local_4c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_4d0,local_4b0,local_4b0 + local_4a8);
            std::__cxx11::string::append((char *)local_4d0);
            std::__cxx11::string::operator=((string *)&tile_file_abi_cxx11_,(string *)local_4d0);
            if (local_4d0[0] != local_4c0) {
              operator_delete(local_4d0[0]);
            }
            local_4d0[0] = local_4c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_4d0,local_4b0,local_4b0 + local_4a8);
            std::__cxx11::string::append((char *)local_4d0);
            std::__cxx11::string::operator=((string *)&dict_file_abi_cxx11_,(string *)local_4d0);
            if (local_4d0[0] != local_4c0) {
              operator_delete(local_4d0[0]);
            }
            local_4d0[0] = local_4c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_4d0,local_4b0,local_4b0 + local_4a8);
            std::__cxx11::string::append((char *)local_4d0);
            std::__cxx11::string::operator=((string *)&dict_bin_abi_cxx11_,(string *)local_4d0);
            if (local_4d0[0] != local_4c0) {
              operator_delete(local_4d0[0]);
            }
            if (local_4b0 != local_4a0) {
              operator_delete(local_4b0);
            }
          }
          else if (bVar3 == 100) {
            psVar11 = &dict_file_abi_cxx11_;
            goto LAB_0010bbe7;
          }
        }
        else if (bVar3 == 0x70) {
          std::istream::operator>>((istream *)local_438,&local_4d4);
          local_47c = *argv[3] + -0x30;
          if (local_480 == 5) {
            go_first = false;
          }
          local_478 = 1;
        }
        else if (bVar3 == 0x72) {
          local_470 = 1;
        }
        else {
          psVar11 = &tile_file_abi_cxx11_;
          if (bVar3 == 0x74) goto LAB_0010bbe7;
        }
        if ((pointer *)
            local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != ppcVar1) {
          operator_delete(local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_230);
        std::ios_base::~ios_base(local_440);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_438);
        std::ios_base::~ios_base(local_490);
        puVar8 = local_448;
        puVar9 = local_488;
      }
      puVar9 = puVar9 + 1;
    } while (puVar8 != puVar9);
    bVar3 = (byte)local_470;
    uVar10 = local_478;
  }
  init((EVP_PKEY_CTX *)(ulong)(bVar3 & 1));
  if ((uVar10 & 1) == 0) {
    calc_adj();
    if (((byte)__gmon_start__[*(long *)(std::cin + -0x18)] & 5) == 0) {
      do {
        local_438[0]._M_string_length = 0;
        local_438[0].field_2._M_local_buf[0] = '\0';
        local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
        cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '`');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)local_438,cVar4);
        do_command(local_438,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
          operator_delete(local_438[0]._M_dataplus._M_p);
        }
      } while (((byte)__gmon_start__[*(long *)(std::cin + -0x18)] & 5) == 0);
    }
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector(&local_468,&bag);
    if (0 < local_4d4) {
      local_488 = _VTT;
      local_490 = _memcpy;
      uVar10 = 0;
      iVar12 = 0;
      do {
        iVar5 = play_program(go_first,local_47c);
        clear();
        std::vector<char,_std::allocator<char>_>::operator=(&bag,&local_468);
        uVar7 = seed / 0x7fffffff << 0x1f | seed / 0x7fffffff;
        local_438[0]._M_dataplus._M_p = (pointer)(ulong)(uVar7 + seed + (uint)(seed + uVar7 == 0));
        seed = seed + 1;
        std::
        shuffle<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                  ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                   bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                   bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                   local_438);
        my_rack_size = 0;
        rack_size = 0;
        iVar12 = iVar12 + (uint)(iVar5 == 1);
        if ((int)(uVar10 / 10) * 10 == (int)uVar10) {
          std::ifstream::ifstream(local_438,"record.txt",_S_in);
          local_4b0 = (undefined1 *)((ulong)local_4b0 & 0xffffffff00000000);
          local_4d0[0] = (undefined1 *)((ulong)local_4d0[0] & 0xffffffff00000000);
          this = (istream *)std::istream::operator>>((istream *)local_438,(int *)&local_4b0);
          std::istream::operator>>(this,(int *)local_4d0);
          std::ifstream::close();
          std::ofstream::ofstream((ostream *)&local_230,"record.txt",_S_trunc);
          this_00 = (ostream *)
                    std::ostream::operator<<((ostream *)&local_230,iVar12 + (int)local_4b0);
          std::__ostream_insert<char,std::char_traits<char>>(this_00," ",1);
          std::ostream::operator<<((ostream *)this_00,(int)local_4d0[0] + 10);
          std::ofstream::close();
          local_230 = local_488;
          *(ios_base **)(local_228 + *(long *)(local_488 + -0x18) + -8) = local_490;
          std::filebuf::~filebuf(local_228);
          std::ios_base::~ios_base(local_138);
          std::ifstream::~ifstream(local_438);
          iVar12 = 0;
        }
        go_first = (bool)(go_first ^ 1);
        uVar7 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar7;
      } while ((int)uVar7 < local_4d4);
    }
    if ((pointer *)
        local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    bool rebuild = false;
    bool playing_self = false;
    bool go_first = true;
    int num_games = -1, verbosity;
    for (int i = 0; i < argc; i++) {
        char *s = argv[i];
        if (s[0] != '-') continue;
        stringstream ss(s + 3);
        stringstream sss;
        string ab;
        switch (s[1]) {
            case 'b':
                ss >> board_file;
                break;
            case 't':
                ss >> tile_file;
                break;
            case 'd':
                ss >> dict_file;
                break;
            case 'r':
                rebuild = true;
                break;
            case 'p':
                playing_self = true;
                ss >> num_games;
                verbosity = argv[3][0] - '0';
                //ab=string(argv[3]);
                //sss=stringstream{ab};
                //sss>>seed;
                if (argc == 5) go_first = false;
                break;
            case 'c':
                string dir;
                ss >> dir;
                board_file = dir + "/board.txt";
                tile_file = dir + "/tiles.txt";
                dict_file = dir + "/dict.txt";
                dict_bin = dir + "/dict.bin";
                break;
        }
    }
    init(rebuild);
    if (playing_self) {
        int wins = 0;
        const vector<char> baggy = bag;
        for (int i = 0; i < num_games; i++) {
            int res = play_program(go_first, verbosity);
            clear();
            bag = baggy;
            shuffle(bag.begin(), bag.end(), default_random_engine(seed++));
            rack_size = my_rack_size = 0;
            go_first = !go_first;
            wins += (res == 1);
            if (i % 10 == 0) {
                ifstream record("record.txt");
                int win1 = 0, tot1 = 0;
                record >> win1 >> tot1;
                record.close();
                ofstream recor("record.txt", ios::trunc);
                recor << win1 + wins << " " << tot1 + 10;
                recor.close();
                wins = 0;
            }
        }
        return 0;
    }
    calc_adj();
    while (cin) {
        string s;
        getline(cin, s);
        do_command(s, false);
    }
}